

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

TString * luaS_newlstr(lua_State *L,char *str,size_t l)

{
  int iVar1;
  TString *pTVar2;
  TString *ts;
  size_t l1;
  size_t step;
  GCObject *pGStack_30;
  uint h;
  GCObject *o;
  size_t l_local;
  char *str_local;
  lua_State *L_local;
  
  step._4_4_ = (uint)l;
  pTVar2 = (TString *)((l >> 5) + 1);
  for (ts = (TString *)l; pTVar2 <= ts; ts = (TString *)((long)ts - (long)pTVar2)) {
    step._4_4_ = step._4_4_ ^ step._4_4_ * 0x20 + (step._4_4_ >> 2) + (uint)(byte)str[(long)ts + -1]
    ;
  }
  pGStack_30 = (L->l_G->strt).hash[(int)(step._4_4_ & (L->l_G->strt).size - 1U)];
  while( true ) {
    if (pGStack_30 == (GCObject *)0x0) {
      pTVar2 = newlstr(L,str,l,step._4_4_);
      return pTVar2;
    }
    if (((pGStack_30->h).metatable == (Table *)l) &&
       (iVar1 = memcmp(str,&(pGStack_30->h).array,l), iVar1 == 0)) break;
    pGStack_30 = (pGStack_30->gch).next;
  }
  if (((pGStack_30->gch).marked & (L->l_G->currentwhite ^ 3) & 3) != 0) {
    (pGStack_30->gch).marked = (pGStack_30->gch).marked ^ 3;
  }
  return (TString *)pGStack_30;
}

Assistant:

static TString*luaS_newlstr(lua_State*L,const char*str,size_t l){
GCObject*o;
unsigned int h=cast(unsigned int,l);
size_t step=(l>>5)+1;
size_t l1;
for(l1=l;l1>=step;l1-=step)
h=h^((h<<5)+(h>>2)+cast(unsigned char,str[l1-1]));
for(o=G(L)->strt.hash[lmod(h,G(L)->strt.size)];
o!=NULL;
o=o->gch.next){
TString*ts=rawgco2ts(o);
if(ts->tsv.len==l&&(memcmp(str,getstr(ts),l)==0)){
if(isdead(G(L),o))changewhite(o);
return ts;
}
}
return newlstr(L,str,l,h);
}